

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O1

void __thiscall
embree::ImageT<embree::Col3<unsigned_char>_>::ImageT
          (ImageT<embree::Col3<unsigned_char>_> *this,size_t width,size_t height,string *name)

{
  pointer pcVar1;
  undefined1 auVar2 [16];
  Col3<unsigned_char> *__s;
  ulong uVar3;
  
  (this->super_Image).super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (this->super_Image).super_RefCount._vptr_RefCount = (_func_int **)&PTR__Image_002cac08;
  (this->super_Image).width = width;
  (this->super_Image).height = height;
  (this->super_Image).name._M_dataplus._M_p = (pointer)&(this->super_Image).name.field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_Image).name,pcVar1,pcVar1 + name->_M_string_length);
  (this->super_Image).super_RefCount._vptr_RefCount = (_func_int **)&PTR__ImageT_002cc1f0;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = height * width;
  uVar3 = 0xffffffffffffffff;
  if (SUB168(auVar2 * ZEXT816(3),8) == 0) {
    uVar3 = SUB168(auVar2 * ZEXT816(3),0);
  }
  __s = (Col3<unsigned_char> *)operator_new__(uVar3);
  this->data = __s;
  memset(__s,0,height * width * 3);
  return;
}

Assistant:

ImageT (size_t width = 0, size_t height = 0, const std::string& name = "")
      : Image(width,height,name)
    {
      data = new T[width*height];
      memset((void*)data,0,width*height*sizeof(T));
    }